

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

bool __thiscall Catch::Matchers::EndsWithMatcher::match(EndsWithMatcher *this,string *source)

{
  bool bVar1;
  string local_38;
  string *local_18;
  string *source_local;
  EndsWithMatcher *this_local;
  
  local_18 = source;
  source_local = (string *)this;
  CasedString::adjustString(&local_38,&(this->super_StringMatcherBase).m_comparator,source);
  bVar1 = endsWith(&local_38,&(this->super_StringMatcherBase).m_comparator.m_str);
  std::__cxx11::string::~string((string *)&local_38);
  return bVar1;
}

Assistant:

bool EndsWithMatcher::match(std::string const &source) const {
            return endsWith(m_comparator.adjustString(source), m_comparator.m_str);
        }